

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::UnknownFieldParserHelper::ParseGroup
          (UnknownFieldParserHelper *this,uint32 num,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint32 start_tag;
  int iVar2;
  UnknownFieldSet *unknown;
  EpsCopyInputStream *in_RCX;
  int in_ESI;
  UnknownFieldParserHelper child;
  UnknownFieldParserHelper in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffdc;
  UnknownFieldSet *in_stack_ffffffffffffffe0;
  char *local_8;
  
  unknown = UnknownFieldSet::AddGroup(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  UnknownFieldParserHelper((UnknownFieldParserHelper *)&stack0xffffffffffffffb0,unknown);
  start_tag = in_ESI * 8 + 3;
  iVar2 = *(int *)&in_RCX[1].limit_end_ + -1;
  *(int *)&in_RCX[1].limit_end_ = iVar2;
  if (iVar2 < 0) {
    local_8 = (char *)0x0;
  }
  else {
    *(int *)((long)&in_RCX[1].limit_end_ + 4) = *(int *)((long)&in_RCX[1].limit_end_ + 4) + 1;
    local_8 = _InternalParse((UnknownFieldParserHelper *)in_stack_ffffffffffffffb0.unknown_,
                             (char *)in_RCX,(ParseContext *)0x46d47f);
    *(int *)((long)&in_RCX[1].limit_end_ + 4) = *(int *)((long)&in_RCX[1].limit_end_ + 4) + -1;
    *(int *)&in_RCX[1].limit_end_ = *(int *)&in_RCX[1].limit_end_ + 1;
    bVar1 = EpsCopyInputStream::ConsumeEndGroup(in_RCX,start_tag);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

const char* ParseGroup(uint32 num, const char* ptr, ParseContext* ctx) {
    UnknownFieldParserHelper child(unknown_->AddGroup(num));
    return ctx->ParseGroup(&child, ptr, num * 8 + 3);
  }